

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

BLOB_RESULT
Blob_PutBlockList(HTTPAPIEX_HANDLE httpApiExHandle,char *relativePath,
                 SINGLYLINKEDLIST_HANDLE blockIDList,uint *httpStatus,BUFFER_HANDLE httpResponse)

{
  char *handle;
  int iVar1;
  HTTPAPIEX_RESULT HVar2;
  LIST_ITEM_HANDLE pLVar3;
  char *relativePath_00;
  LOGGER_LOG p_Var4;
  undefined4 uVar5;
  LOGGER_LOG l_6;
  LOGGER_LOG p_Stack_a0;
  uint httpResponseStatusCode;
  LOGGER_LOG l_5;
  BUFFER_HANDLE blockIDListAsBuffer;
  size_t blockIdListXmlLength;
  char *blockIdListXmlCharPtr;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  STRING_HANDLE newRelativePath;
  LOGGER_LOG l_2;
  STRING_HANDLE blockIdListXml;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER_HANDLE pBStack_40;
  BLOB_RESULT result;
  BUFFER_HANDLE httpResponse_local;
  uint *httpStatus_local;
  SINGLYLINKEDLIST_HANDLE blockIDList_local;
  char *relativePath_local;
  HTTPAPIEX_HANDLE httpApiExHandle_local;
  
  pBStack_40 = httpResponse;
  httpResponse_local = (BUFFER_HANDLE)httpStatus;
  httpStatus_local = (uint *)blockIDList;
  blockIDList_local = (SINGLYLINKEDLIST_HANDLE)relativePath;
  relativePath_local = (char *)httpApiExHandle;
  if ((((httpApiExHandle == (HTTPAPIEX_HANDLE)0x0) || (relativePath == (char *)0x0)) ||
      (blockIDList == (SINGLYLINKEDLIST_HANDLE)0x0)) || (httpStatus == (uint *)0x0)) {
    l_1 = xlogging_get_log_function();
    if (l_1 != (LOGGER_LOG)0x0) {
      (*l_1)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
             ,"Blob_PutBlockList",0x112,1,
             "Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)"
             ,relativePath_local,blockIDList_local,httpStatus_local,httpResponse_local);
    }
    l._4_4_ = BLOB_INVALID_ARG;
  }
  else {
    pLVar3 = singlylinkedlist_get_head_item(blockIDList);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      blockIdListXml = (STRING_HANDLE)xlogging_get_log_function();
      if (blockIdListXml != (STRING_HANDLE)0x0) {
        (*(code *)blockIdListXml)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                   ,"Blob_PutBlockList",0x11a,1,"Block ID list is empty");
      }
      l._4_4_ = BLOB_ERROR;
    }
    else {
      l_2 = (LOGGER_LOG)createBlockIdListXml((SINGLYLINKEDLIST_HANDLE)httpStatus_local);
      if ((STRING_HANDLE)l_2 == (STRING_HANDLE)0x0) {
        newRelativePath = (STRING_HANDLE)xlogging_get_log_function();
        if (newRelativePath != (STRING_HANDLE)0x0) {
          (*(code *)newRelativePath)
                    (0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                     ,"Blob_PutBlockList",0x124,1,"failed creating Block ID list XML");
        }
        l._4_4_ = BLOB_ERROR;
      }
      else {
        l_3 = (LOGGER_LOG)STRING_construct((char *)blockIDList_local);
        if ((STRING_HANDLE)l_3 == (STRING_HANDLE)0x0) {
          l_4 = xlogging_get_log_function();
          if (l_4 != (LOGGER_LOG)0x0) {
            (*l_4)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                   ,"Blob_PutBlockList",0x12d,1,"failed to STRING_construct");
          }
          l._4_4_ = BLOB_ERROR;
        }
        else {
          iVar1 = STRING_concat((STRING_HANDLE)l_3,"&comp=blocklist");
          if (iVar1 == 0) {
            blockIdListXmlLength = (size_t)STRING_c_str((STRING_HANDLE)l_2);
            blockIDListAsBuffer = (BUFFER_HANDLE)STRING_length((STRING_HANDLE)l_2);
            l_5 = (LOGGER_LOG)
                  BUFFER_create((uchar *)blockIdListXmlLength,(size_t)blockIDListAsBuffer);
            handle = relativePath_local;
            if ((BUFFER_HANDLE)l_5 == (BUFFER_HANDLE)0x0) {
              p_Stack_a0 = xlogging_get_log_function();
              if (p_Stack_a0 != (LOGGER_LOG)0x0) {
                (*p_Stack_a0)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                              ,"Blob_PutBlockList",0x13f,1,"failed to BUFFER_create");
              }
              l._4_4_ = BLOB_ERROR;
            }
            else {
              l_6._4_4_ = 0;
              relativePath_00 = STRING_c_str((STRING_HANDLE)l_3);
              uVar5 = 0;
              HVar2 = HTTPAPIEX_ExecuteRequest
                                ((HTTPAPIEX_HANDLE)handle,HTTPAPI_REQUEST_PUT,relativePath_00,
                                 (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)l_5,
                                 (uint *)((long)&l_6 + 4),(HTTP_HEADERS_HANDLE)0x0,pBStack_40);
              if (((HVar2 == HTTPAPIEX_OK) && (99 < l_6._4_4_)) && (l_6._4_4_ < 300)) {
                singlylinkedlist_remove_if
                          ((SINGLYLINKEDLIST_HANDLE)httpStatus_local,removeAndDestroyBlockIdInList,
                           (void *)0x0);
                l._4_4_ = BLOB_OK;
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                            ,"Blob_PutBlockList",0x151,1,
                            "unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)",
                            CONCAT44(uVar5,l_6._4_4_));
                }
                l._4_4_ = BLOB_HTTP_ERROR;
              }
              if (httpResponse_local != (BUFFER_HANDLE)0x0) {
                *(uint *)&httpResponse_local->buffer = l_6._4_4_;
              }
              BUFFER_delete((BUFFER_HANDLE)l_5);
            }
          }
          else {
            blockIdListXmlCharPtr = (char *)xlogging_get_log_function();
            if ((LOGGER_LOG)blockIdListXmlCharPtr != (LOGGER_LOG)0x0) {
              (*(code *)blockIdListXmlCharPtr)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                         ,"Blob_PutBlockList",0x134,1,"failed to STRING_concat");
            }
            l._4_4_ = BLOB_ERROR;
          }
          STRING_delete((STRING_HANDLE)l_3);
        }
        STRING_delete((STRING_HANDLE)l_2);
      }
    }
  }
  return l._4_4_;
}

Assistant:

BLOB_RESULT Blob_PutBlockList(
    HTTPAPIEX_HANDLE httpApiExHandle,
    const char* relativePath,
    SINGLYLINKEDLIST_HANDLE blockIDList,
    unsigned int* httpStatus,
    BUFFER_HANDLE httpResponse)
{
    BLOB_RESULT result;

    if (httpApiExHandle == NULL || relativePath == NULL || blockIDList == NULL || httpStatus == NULL)
    {
        LogError("Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)",
            httpApiExHandle, relativePath, blockIDList, httpStatus);
            result = BLOB_INVALID_ARG;
    }
    else if (singlylinkedlist_get_head_item(blockIDList) == NULL)
    {
        // Block ID List is empty, there is nothing to be be sent to Azure Blob Storage.
        // In this case we better return error, forcing the caller to call this function only
        // if at least one call to Blob_PutBlock() succeeds.
        LogError("Block ID list is empty");
        result = BLOB_ERROR;
    }
    else
    {
        STRING_HANDLE blockIdListXml = createBlockIdListXml(blockIDList);
        
        /*complete the XML*/
        if (blockIdListXml == NULL)
        {
            LogError("failed creating Block ID list XML");
            result = BLOB_ERROR;
        }
        else
        {
            STRING_HANDLE newRelativePath = STRING_construct(relativePath);

            if (newRelativePath == NULL)
            {
                LogError("failed to STRING_construct");
                result = BLOB_ERROR;
            }
            else
            {
                if (STRING_concat(newRelativePath, blockListUriMarker) != 0)
                {
                    LogError("failed to STRING_concat");
                    result = BLOB_ERROR;
                }
                else
                {
                    const char* blockIdListXmlCharPtr = STRING_c_str(blockIdListXml);
                    size_t blockIdListXmlLength = STRING_length(blockIdListXml);
                    BUFFER_HANDLE blockIDListAsBuffer = BUFFER_create((const unsigned char*)blockIdListXmlCharPtr, blockIdListXmlLength);

                    if (blockIDListAsBuffer == NULL)
                    {
                        LogError("failed to BUFFER_create");
                        result = BLOB_ERROR;
                    }
                    else
                    {
                        unsigned int httpResponseStatusCode = 0;

                        if (HTTPAPIEX_ExecuteRequest(
                                httpApiExHandle,
                                HTTPAPI_REQUEST_PUT,
                                STRING_c_str(newRelativePath),
                                NULL,
                                blockIDListAsBuffer,
                                &httpResponseStatusCode,
                                NULL,
                                httpResponse) != HTTPAPIEX_OK ||
                                !IS_HTTP_STATUS_CODE_SUCCESS(httpResponseStatusCode))
                        {
                            LogError("unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)", httpResponseStatusCode);
                            result = BLOB_HTTP_ERROR;
                        }
                        else
                        {
                            (void)singlylinkedlist_remove_if(blockIDList, removeAndDestroyBlockIdInList, NULL);
                            result = BLOB_OK;
                        }

                        if (httpStatus != NULL)
                        {
                            *httpStatus = httpResponseStatusCode;
                        }
                        
                        BUFFER_delete(blockIDListAsBuffer);
                    }
                }
                STRING_delete(newRelativePath);
            }

            STRING_delete(blockIdListXml);
        }
    }

    return result;
}